

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

element_t __thiscall mat_lib::matrix<double>::get(matrix<double> *this,size_t row,size_t column)

{
  logic_error *this_00;
  
  if ((column < this->columns__) && (row < this->rows__)) {
    return this->elements__[this->columns__ * row + (long)(int)column];
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad dimension");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t columns() const { return columns__; }